

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

QRect __thiscall QTreeViewPrivate::itemDecorationRect(QTreeViewPrivate *this,QModelIndex *index)

{
  QWidget *this_00;
  QHeaderView *pQVar1;
  char cVar2;
  bool bVar3;
  uint item;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  QStyle *pQVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  undefined1 auVar13 [16];
  QRect QVar14;
  undefined1 local_78 [16];
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  undefined8 uStack_60;
  undefined1 *local_58;
  QPalettePrivate *pQStack_50;
  undefined1 *local_48;
  QObject *pQStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar11 = 0xffffffff00000000;
  uVar10 = 0xffffffff;
  this_00 = *(QWidget **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  if (this->rootDecoration == false) {
    QModelIndex::parent((QModelIndex *)local_78,index);
    cVar2 = ::comparesEqual(&(this->super_QAbstractItemViewPrivate).root,(QModelIndex *)local_78);
    if (cVar2 != '\0') {
      uVar8 = 0;
      uVar12 = 0;
      goto LAB_005484c1;
    }
  }
  item = viewIndex(this,index);
  if (-1 < (int)item) {
    bVar3 = hasVisibleChildren(this,&(this->viewItems).d.ptr[item].index);
    if (bVar3) {
      iVar4 = indentationForItem(this,item);
      pQVar1 = this->header;
      iVar5 = logicalIndexForTree(this);
      iVar5 = QHeaderView::sectionViewportPosition(pQVar1,iVar5);
      pQVar1 = this->header;
      iVar6 = logicalIndexForTree(this);
      iVar6 = QHeaderView::sectionSize(pQVar1,iVar6);
      bVar3 = QWidget::isRightToLeft(this_00);
      if (bVar3) {
        iVar6 = (iVar5 - iVar4) + iVar6;
      }
      else {
        iVar6 = (iVar5 + iVar4) - this->indent;
      }
      iVar5 = coordinateForItem(this,item);
      iVar4 = this->indent;
      iVar7 = itemHeight(this,item);
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_50 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      uStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOption::QStyleOption((QStyleOption *)local_78,1,0);
      QStyleOption::initFrom((QStyleOption *)local_78,this_00);
      local_68.ptr._4_4_ = iVar5;
      local_68.ptr._0_4_ = iVar6;
      uStack_60._4_4_ = iVar5 + -1 + iVar7;
      uStack_60._0_4_ = iVar4 + iVar6 + -1;
      pQVar9 = QWidget::style(this_00);
      auVar13 = (**(code **)(*(long *)pQVar9 + 0xc0))(pQVar9,0x19,local_78,this_00);
      uVar12 = auVar13._0_8_ & 0xffffffff00000000;
      uVar11 = auVar13._8_8_ & 0xffffffff00000000;
      QStyleOption::~QStyleOption((QStyleOption *)local_78);
      uVar8 = auVar13._0_8_ & 0xffffffff;
      uVar10 = auVar13._8_8_ & 0xffffffff;
      goto LAB_005484c1;
    }
  }
  uVar8 = 0;
  uVar12 = 0;
  uVar11 = 0xffffffff00000000;
LAB_005484c1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar14.x2.m_i = (int)(uVar11 | uVar10);
    QVar14.y2.m_i = (int)((uVar11 | uVar10) >> 0x20);
    QVar14.x1.m_i = (int)(uVar12 | uVar8);
    QVar14.y1.m_i = (int)((uVar12 | uVar8) >> 0x20);
    return QVar14;
  }
  __stack_chk_fail();
}

Assistant:

QRect QTreeViewPrivate::itemDecorationRect(const QModelIndex &index) const
{
    Q_Q(const QTreeView);
    if (!rootDecoration && index.parent() == root)
        return QRect(); // no decoration at root

    int viewItemIndex = viewIndex(index);
    if (viewItemIndex < 0 || !hasVisibleChildren(viewItems.at(viewItemIndex).index))
        return QRect();

    int itemIndentation = indentationForItem(viewItemIndex);
    int position = header->sectionViewportPosition(logicalIndexForTree());
    int size = header->sectionSize(logicalIndexForTree());

    QRect rect;
    if (q->isRightToLeft())
        rect = QRect(position + size - itemIndentation, coordinateForItem(viewItemIndex),
                     indent, itemHeight(viewItemIndex));
    else
        rect = QRect(position + itemIndentation - indent, coordinateForItem(viewItemIndex),
                     indent, itemHeight(viewItemIndex));
    QStyleOption opt;
    opt.initFrom(q);
    opt.rect = rect;
    return q->style()->subElementRect(QStyle::SE_TreeViewDisclosureItem, &opt, q);
}